

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  Tables *this_00;
  Symbol symbol;
  EnumDescriptor *parent_00;
  Descriptor *proto_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  EnumValueDescriptorProto *proto_01;
  EnumOptions *orig_options;
  string *name;
  string *local_60;
  Symbol local_50;
  int local_3c;
  string *psStack_38;
  int i;
  string *full_name;
  string *scope;
  EnumDescriptor *result_local;
  Descriptor *parent_local;
  EnumDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  scope = (string *)result;
  result_local = (EnumDescriptor *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (EnumDescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    local_60 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_60 = Descriptor::full_name_abi_cxx11_(parent);
  }
  full_name = local_60;
  psStack_38 = DescriptorPool::Tables::AllocateString(this->tables_,local_60);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::append((ulong)psStack_38,'\x01');
  }
  psVar5 = psStack_38;
  EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)parent_local);
  std::__cxx11::string::append((string *)psVar5);
  psVar5 = EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar5,psStack_38,(Message *)parent_local);
  this_00 = this->tables_;
  psVar5 = EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)parent_local);
  psVar5 = DescriptorPool::Tables::AllocateString(this_00,psVar5);
  *(string **)scope = psVar5;
  scope->_M_string_length = (size_type)psStack_38;
  (scope->field_2)._M_allocated_capacity = (size_type)this->file_;
  *(EnumDescriptor **)((long)&scope->field_2 + 8) = result_local;
  *(undefined1 *)&scope[1]._M_string_length = 0;
  *(undefined1 *)((long)&scope[1]._M_string_length + 1) = 0;
  iVar2 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
  if (iVar2 == 0) {
    psVar5 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)scope);
    AddError(this,psVar5,(Message *)parent_local,NAME,"Enums must contain at least one value.");
  }
  iVar2 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
  *(int *)((long)&scope[1]._M_string_length + 4) = iVar2;
  iVar2 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
  AllocateArray<google::protobuf::EnumValueDescriptor>
            (this,iVar2,(EnumValueDescriptor **)&scope[1].field_2._M_allocated_capacity);
  local_3c = 0;
  while( true ) {
    iVar2 = local_3c;
    iVar3 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
    if (iVar3 <= iVar2) break;
    proto_01 = EnumDescriptorProto::value((EnumDescriptorProto *)parent_local,local_3c);
    BuildEnumValue(this,proto_01,(EnumDescriptor *)scope,
                   (EnumValueDescriptor *)
                   (scope[1].field_2._M_allocated_capacity + (long)local_3c * 0x28));
    local_3c = local_3c + 1;
  }
  CheckEnumValueUniqueness(this,(EnumDescriptorProto *)parent_local,(EnumDescriptor *)scope);
  bVar1 = EnumDescriptorProto::has_options((EnumDescriptorProto *)parent_local);
  if (bVar1) {
    orig_options = EnumDescriptorProto::options((EnumDescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::EnumDescriptor>(this,orig_options,(EnumDescriptor *)scope);
  }
  else {
    *(undefined8 *)(scope + 1) = 0;
  }
  psVar5 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)scope);
  parent_00 = result_local;
  name = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)scope);
  proto_00 = parent_local;
  Symbol::Symbol(&local_50,(EnumDescriptor *)scope);
  symbol.field_1.descriptor = local_50.field_1.descriptor;
  symbol.type = local_50.type;
  symbol._4_4_ = local_50._4_4_;
  AddSymbol(this,psVar5,parent_00,name,(Message *)proto_00,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);

  CheckEnumValueUniqueness(proto, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}